

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils-c.cpp
# Opt level: O3

bool duckdb::FromCBlobCastWrapper::Operation<duckdb_blob,duckdb_string>
               (duckdb_blob input,duckdb_string *result)

{
  bool bVar1;
  duckdb_string *in_RCX;
  uint uVar2;
  undefined4 *__src;
  string_t input_00;
  undefined4 uStack_1c;
  undefined4 uStack_18;
  undefined4 local_14;
  
  __src = (undefined4 *)input.data;
  uVar2 = (uint)input.size;
  if (uVar2 < 0xd) {
    local_14 = 0;
    uStack_1c = 0;
    uStack_18 = 0;
    if (uVar2 == 0) {
      __src = (undefined4 *)0x0;
    }
    else {
      switchD_012b9b0d::default(&uStack_1c,__src,(ulong)(uVar2 & 0xf));
      __src = (undefined4 *)CONCAT44(local_14,uStack_18);
    }
  }
  else {
    uStack_1c = *__src;
  }
  input_00.value.pointer.ptr = (char *)result;
  input_00.value._0_8_ = __src;
  bVar1 = ToCStringCastWrapper<duckdb::CastFromBlob>::Operation<duckdb::string_t,duckdb_string>
                    ((ToCStringCastWrapper<duckdb::CastFromBlob> *)CONCAT44(uStack_1c,uVar2),
                     input_00,in_RCX);
  return bVar1;
}

Assistant:

bool FromCBlobCastWrapper::Operation(duckdb_blob input, duckdb_string &result) {
	string_t input_str(const_char_ptr_cast(input.data), UnsafeNumericCast<uint32_t>(input.size));
	return ToCStringCastWrapper<duckdb::CastFromBlob>::template Operation<string_t, duckdb_string>(input_str, result);
}